

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O2

void __thiscall SchemePrimitiveProcedure::~SchemePrimitiveProcedure(SchemePrimitiveProcedure *this)

{
  SchemeProcedure::~SchemeProcedure(&this->super_SchemeProcedure);
  operator_delete(this,0x38);
  return;
}

Assistant:

SchemePrimitiveProcedure(const std::string &name_, long long minargs, long long maxargs)
    {
        name = name_;
        arity.first = minargs;
        arity.second = maxargs;
    }